

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O2

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar6 = bottom_top_blob->h * bottom_top_blob->w;
  pvVar9 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  iVar1 = this->affine;
  pvVar3 = (this->gamma_data).data;
  pvVar4 = (this->beta_data).data;
  uVar10 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar10;
  }
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar10;
  }
  sVar5 = bottom_top_blob->elemsize;
  for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    fVar12 = 0.0;
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      fVar12 = fVar12 + *(float *)((long)pvVar9 + uVar11 * 4);
    }
    fVar12 = fVar12 * (1.0 / (float)(int)uVar6);
    fVar14 = 0.0;
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      fVar13 = *(float *)((long)pvVar9 + uVar11 * 4) - fVar12;
      fVar14 = fVar14 + fVar13 * fVar13;
    }
    fVar14 = fVar14 * (1.0 / (float)(int)uVar6);
    if (iVar1 == 0) {
      fVar14 = 1.0 / SQRT(fVar14 + this->eps);
      fVar12 = -fVar12 * fVar14;
    }
    else {
      fVar14 = *(float *)((long)pvVar3 + uVar10 * 4) / SQRT(fVar14 + this->eps);
      fVar12 = *(float *)((long)pvVar4 + uVar10 * 4) - fVar12 * fVar14;
    }
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      *(float *)((long)pvVar9 + uVar11 * 4) =
           *(float *)((long)pvVar9 + uVar11 * 4) * fVar14 + fVar12;
    }
    pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar5);
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var + eps)) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int c = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < c; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i = 0; i < size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float a;
        float b;
        if (affine)
        {
            float gamma = gamma_data[q];
            float beta = beta_data[q];

            a = gamma / (sqrtf(var + eps));
            b = -mean * a + beta;
        }
        else
        {
            a = 1.f / (sqrtf(var + eps));
            b = -mean * a;
        }

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}